

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_token_attr<tinyusdz::UsdUVTexture::SourceColorSpace>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                   *attr,string *name,uint32_t indent)

{
  Path *v;
  bool bVar1;
  Animatable<tinyusdz::UsdUVTexture::SourceColorSpace> *this;
  ostream *poVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  pprint *ppVar4;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n;
  SourceColorSpace v_00;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX_01;
  char *pcVar5;
  uint32_t uVar6;
  stringstream ss;
  allocator local_229;
  pprint *local_228;
  string *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ppVar4 = (pprint *)CONCAT44(in_register_0000000c,indent);
  local_228 = ppVar4;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  uVar6 = (uint32_t)ppVar4;
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
          ::authored(attr);
  if (!bVar1) goto LAB_00253cfb;
  this = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
         ::get_value(attr);
  bVar1 = AttrMetas::authored(&attr->_metas);
  n = extraout_EDX;
  local_220 = __return_storage_ptr__;
  if ((bVar1) || (this->_has_value != false)) {
LAB_002539ef:
    pprint::Indent_abi_cxx11_(&local_218,local_228,n);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::_M_dispose();
    poVar2 = ::std::operator<<(local_1a8,"token ");
    poVar2 = ::std::operator<<(poVar2,(string *)name);
    ::std::operator<<(poVar2," = ");
    if (this->_blocked == true) {
      pcVar5 = "None";
LAB_00253ad8:
      ::std::operator<<(local_1a8,pcVar5);
    }
    else {
      if (this->_has_value != true) {
        pcVar5 = "[Animatable: InternalError]";
        goto LAB_00253ad8;
      }
      to_string_abi_cxx11_(&local_1f8,(tinyusdz *)(ulong)this->_value,v_00);
      ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_229);
      quote(&local_218,&local_1f8,&local_1d8);
      ::std::operator<<(local_1a8,(string *)&local_218);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      poVar2 = ::std::operator<<(local_1a8," (\n");
      ppVar4 = local_228;
      print_attr_metas_abi_cxx11_
                (&local_218,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)local_228 + 1),uVar6);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_218);
      pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)ppVar4 & 0xffffffff),n_00);
      __return_storage_ptr__ = local_220;
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1f8);
      ::std::operator<<(poVar2,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
  }
  else {
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
            ::is_value_empty(attr);
    n = extraout_EDX_00;
    if (bVar1) goto LAB_002539ef;
  }
  bVar1 = Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>::has_timesamples(this);
  uVar6 = n_01;
  if (bVar1) {
    uVar6 = (uint32_t)local_228;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)local_228 & 0xffffffff),n_01);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::_M_dispose();
    poVar2 = ::std::operator<<(local_1a8,"token ");
    poVar2 = ::std::operator<<(poVar2,(string *)name);
    ::std::operator<<(poVar2,".timeSamples = ");
    print_typed_token_timesamples<tinyusdz::UsdUVTexture::SourceColorSpace>
              (&local_218,&this->_ts,uVar6);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::_M_dispose();
    __return_storage_ptr__ = local_220;
    ::std::operator<<(local_1a8,"\n");
    uVar6 = extraout_EDX_01;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_218,local_228,uVar6);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::_M_dispose();
    poVar2 = ::std::operator<<(local_1a8,"token ");
    ::std::operator<<(poVar2,(string *)name);
    ::std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar3 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar3 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar3 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
LAB_00253cfb:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    if (attr.metas().authored() || v.has_value() || attr.is_value_empty()) {
      ss << pprint::Indent(indent);
      ss << "token " << name << " = ";
      if (v.is_blocked()) {
        ss << "None";
      } else {
        T a;
        if (v.get_scalar(&a)) {
          ss << quote(to_string(a));
        } else { 
          ss << "[Animatable: InternalError]";
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {

      ss << pprint::Indent(indent);
      ss << "token " << name << ".timeSamples = ";

      ss << print_typed_token_timesamples(v.get_timesamples(), indent);
      ss << "\n";
    }


    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }


  return ss.str();
}